

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiKeyData * ImGui::GetKeyData(ImGuiKey key)

{
  uint uVar1;
  uint uVar2;
  ImGuiKey IVar3;
  
  IVar3 = key;
  if ((key & ImGuiMod_Mask_) == ImGuiKey_KeysData_OFFSET) {
    if ((key < ImGuiKey_NamedKey_BEGIN) &&
       (IVar3 = (GImGui->IO).KeyMap[key], IVar3 == ~ImGuiKey_KeysData_OFFSET)) {
      IVar3 = key;
    }
  }
  else {
    uVar1 = key - ImGuiKey_ModCtrl >> 0xc;
    uVar2 = key << 0x14 | uVar1;
    if ((uVar2 < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
      IVar3 = *(ImGuiKey *)(&DAT_0025c330 + (ulong)uVar2 * 4);
    }
  }
  return (GImGui->IO).KeysData + (int)IVar3;
}

Assistant:

ImGuiKeyData* ImGui::GetKeyData(ImGuiKey key)
{
    ImGuiContext& g = *GImGui;

    // Special storage location for mods
    if (key & ImGuiMod_Mask_)
        key = ConvertSingleModFlagToKey(key);

    int index;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_NamedKey_END);
    if (IsLegacyKey(key))
        index = (g.IO.KeyMap[key] != -1) ? g.IO.KeyMap[key] : key; // Remap native->imgui or imgui->native
    else
        index = key;
#else
    IM_ASSERT(IsNamedKey(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend & user code.");
    index = key - ImGuiKey_NamedKey_BEGIN;
#endif
    return &g.IO.KeysData[index];
}